

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetBoundingBoxProjectionExtents
          (ON_Viewport *this,ON_BoundingBox bbox,ON_Interval *x_extents,ON_Interval *y_extents)

{
  double dVar1;
  ON_3dPoint from_pt;
  ON_PlaneEquation e_00;
  ON_PlaneEquation e_01;
  ON_PlaneEquation e_02;
  ON_3dPoint to_pt;
  bool bVar2;
  double *pdVar3;
  long lVar4;
  ON_Interval *local_7d0;
  ON_Line *local_798;
  ON_Line *local_758;
  ON_PlaneEquation *local_738;
  double local_710;
  ON_BoundingBox *local_6d8;
  double local_6c8;
  double local_6b8;
  double local_698;
  int local_67c;
  undefined1 auStack_678 [4];
  int i_2;
  ON_Interval extents [2];
  bool local_649;
  undefined1 auStack_648 [7];
  bool rc;
  ON_3dPoint local_630;
  double local_618;
  double dStack_610;
  double local_608;
  double dStack_600;
  int local_5ec;
  double dStack_5e8;
  int j_1;
  double dStack_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8;
  undefined1 auStack_5a8 [8];
  ON_Line line;
  int local_56c;
  undefined1 local_568 [4];
  int i_1;
  ON_Line bbox_lines [12];
  ON_PlaneEquation frustum_sides [4];
  undefined1 auStack_2a0 [8];
  ON_PlaneEquation vp_far_plane;
  ON_PlaneEquation vp_near_plane;
  undefined1 local_258 [8];
  ON_Xform w2c;
  ON_3dPoint P;
  double t;
  ON_3dPoint bbox_point;
  int k;
  undefined1 local_190 [8];
  ON_PlaneEquation e;
  int j;
  int i;
  undefined1 local_138 [8];
  ON_Line camera_ray;
  ON_BoundingBox clipping_bbox;
  ON_3dPoint clipping_point;
  undefined1 local_b8 [8];
  ON_3dPoint far_rect [4];
  undefined1 local_50 [8];
  ON_3dPoint cam_loc;
  ON_Interval unit_interval;
  ON_Interval *y_extents_local;
  ON_Interval *x_extents_local;
  ON_Viewport *this_local;
  
  ON_Interval::ON_Interval((ON_Interval *)&cam_loc.z,0.0,1.0);
  x_extents->m_t[0] = cam_loc.z;
  x_extents->m_t[1] = unit_interval.m_t[0];
  y_extents->m_t[0] = cam_loc.z;
  y_extents->m_t[1] = unit_interval.m_t[0];
  bVar2 = ON_BoundingBox::IsValid(&bbox);
  if (!bVar2) {
    return false;
  }
  bVar2 = IsValidCamera(this);
  if ((!bVar2) && (bVar2 = IsValidFrustum(this), !bVar2)) {
    return false;
  }
  CameraLocation((ON_3dPoint *)local_50,this);
  bVar2 = ON_3dPoint::IsValid((ON_3dPoint *)local_50);
  if (!bVar2) {
    return false;
  }
  bVar2 = GetFarRect(this,(ON_3dPoint *)local_b8,(ON_3dPoint *)&far_rect[0].z,
                     (ON_3dPoint *)&far_rect[2].z,(ON_3dPoint *)&far_rect[1].z);
  if (!bVar2) {
    return false;
  }
  ON_3dPoint::ON_3dPoint
            ((ON_3dPoint *)&clipping_bbox.m_max.z,-1.23432101234321e+308,-1.23432101234321e+308,0.0)
  ;
  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&camera_ray.to.z);
  from_pt.y = cam_loc.x;
  from_pt.x = (double)local_50;
  from_pt.z = cam_loc.y;
  to_pt.y = ON_3dPoint::UnsetPoint.y;
  to_pt.x = ON_3dPoint::UnsetPoint.x;
  to_pt.z = ON_3dPoint::UnsetPoint.z;
  ON_Line::ON_Line((ON_Line *)local_138,from_pt,to_pt);
  for (e.d._4_4_ = 0; e.d._4_4_ < 4; e.d._4_4_ = e.d._4_4_ + 1) {
    lVar4 = (long)e.d._4_4_;
    camera_ray.from.z = far_rect[lVar4 + -1].z;
    camera_ray.to.x = far_rect[lVar4].x;
    camera_ray.to.y = far_rect[lVar4].y;
    for (e.d._0_4_ = 0; e.d._0_4_ < 3; e.d._0_4_ = e.d._0_4_ + 1) {
      local_698 = 1.0;
      if (e.d._0_4_ != 0) {
        local_698 = 0.0;
      }
      local_6b8 = 1.0;
      if (e.d._0_4_ != 1) {
        local_6b8 = 0.0;
      }
      local_6c8 = 1.0;
      if (e.d._0_4_ != 2) {
        local_6c8 = 0.0;
      }
      ON_PlaneEquation::ON_PlaneEquation
                ((ON_PlaneEquation *)local_190,local_698,local_6b8,local_6c8,0.0);
      for (bbox_point.z._0_4_ = 0; bbox_point.z._0_4_ < 2;
          bbox_point.z._0_4_ = bbox_point.z._0_4_ + 1) {
        local_6d8 = &bbox;
        if (bbox_point.z._0_4_ != 0) {
          local_6d8 = (ON_BoundingBox *)&bbox.m_max;
        }
        bbox_point.y = (local_6d8->m_min).z;
        t = (local_6d8->m_min).x;
        bbox_point.x = (local_6d8->m_min).y;
        e.z = 0.0;
        pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&t,e.d._0_4_);
        e.z = -*pdVar3;
        P.z = -1.23432101234321e+308;
        bVar2 = ON_Intersect((ON_Line *)local_138,(ON_PlaneEquation *)local_190,&P.z);
        if ((bVar2) && (0.0 < P.z)) {
          ON_Line::PointAt((ON_3dPoint *)(w2c.m_xform[3] + 3),(ON_Line *)local_138,P.z);
          pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&t,e.d._0_4_);
          dVar1 = *pdVar3;
          pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)(w2c.m_xform[3] + 3),e.d._0_4_);
          *pdVar3 = dVar1;
          bVar2 = ON_BoundingBox::IsPointIn(&bbox,(ON_3dPoint *)(w2c.m_xform[3] + 3),0);
          if (bVar2) {
            local_710 = 1.0;
            if (e.d._4_4_ != 1 && e.d._4_4_ != 2) {
              local_710 = -1.0;
            }
            clipping_bbox.m_max.z = local_710;
            ON_BoundingBox::Set((ON_BoundingBox *)&camera_ray.to.z,
                                (ON_3dPoint *)&clipping_bbox.m_max.z,1);
          }
        }
      }
    }
  }
  if (((((camera_ray.to.z != -1.0) || (clipping_bbox.m_min.x != -1.0)) ||
       (NAN(clipping_bbox.m_min.x))) ||
      ((clipping_bbox.m_min.z != 1.0 || (clipping_bbox.m_max.x != 1.0)))) ||
     (NAN(clipping_bbox.m_max.x))) {
    ON_Xform::ON_Xform((ON_Xform *)local_258);
    bVar2 = GetXform(this,world_cs,clip_cs,(ON_Xform *)local_258);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0098dd26;
    }
    ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)&vp_far_plane.d);
    bVar2 = GetNearPlaneEquation(this,(ON_PlaneEquation *)&vp_far_plane.d);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0098dd26;
    }
    ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)auStack_2a0);
    bVar2 = GetFarPlaneEquation(this,(ON_PlaneEquation *)auStack_2a0);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0098dd26;
    }
    local_738 = (ON_PlaneEquation *)&bbox_lines[0xb].to.z;
    do {
      ON_PlaneEquation::ON_PlaneEquation(local_738);
      local_738 = local_738 + 1;
    } while (local_738 != (ON_PlaneEquation *)&frustum_sides[3].d);
    bVar2 = GetFrustumLeftPlaneEquation(this,(ON_PlaneEquation *)&bbox_lines[0xb].to.z);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0098dd26;
    }
    bVar2 = GetFrustumBottomPlaneEquation(this,(ON_PlaneEquation *)&frustum_sides[0].d);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0098dd26;
    }
    bVar2 = GetFrustumRightPlaneEquation(this,(ON_PlaneEquation *)&frustum_sides[1].d);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0098dd26;
    }
    bVar2 = GetFrustumTopPlaneEquation(this,(ON_PlaneEquation *)&frustum_sides[2].d);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0098dd26;
    }
    local_758 = (ON_Line *)local_568;
    do {
      ON_Line::ON_Line(local_758);
      local_758 = local_758 + 1;
    } while (local_758 != (ON_Line *)&bbox_lines[0xb].to.z);
    ON_BoundingBox::GetEdges(&bbox,(ON_Line *)local_568);
    for (local_56c = 0; local_56c < 0xc; local_56c = local_56c + 1) {
      lVar4 = (long)local_56c;
      auStack_5a8 = *(undefined1 (*) [8])(local_568 + lVar4 * 0x30);
      line.from.x = bbox_lines[lVar4].from.x;
      line.from.y = bbox_lines[lVar4].from.y;
      line.from.z = bbox_lines[lVar4].from.z;
      line.to.x = bbox_lines[lVar4].to.x;
      line.to.y = bbox_lines[lVar4].to.y;
      local_5c8 = vp_far_plane.d;
      e_00.y = vp_near_plane.x;
      e_00.x = vp_far_plane.d;
      e_00.z = vp_near_plane.y;
      e_00.d = vp_near_plane.z;
      bVar2 = TrimLineHelper(e_00,true,(ON_Line *)auStack_5a8);
      if (bVar2) {
        local_5d8 = vp_far_plane.y;
        dStack_5d0 = vp_far_plane.z;
        dStack_5e8 = (double)auStack_2a0;
        dStack_5e0 = vp_far_plane.x;
        e_01.y = vp_far_plane.x;
        e_01.x = (double)auStack_2a0;
        e_01.z = vp_far_plane.y;
        e_01.d = vp_far_plane.z;
        bVar2 = TrimLineHelper(e_01,false,(ON_Line *)auStack_5a8);
        if (bVar2) {
          for (local_5ec = 0; local_5ec < 4; local_5ec = local_5ec + 1) {
            lVar4 = (long)local_5ec;
            local_618 = frustum_sides[lVar4 + -1].d;
            dStack_610 = frustum_sides[lVar4].x;
            local_608 = frustum_sides[lVar4].y;
            dStack_600 = frustum_sides[lVar4].z;
            e_02.y = dStack_610;
            e_02.x = local_618;
            e_02.z = local_608;
            e_02.d = dStack_600;
            bVar2 = TrimLineHelper(e_02,false,(ON_Line *)auStack_5a8);
            if (!bVar2) {
              auStack_5a8 = (undefined1  [8])ON_3dPoint::UnsetPoint.x;
              line.from.x = ON_3dPoint::UnsetPoint.y;
              line.from.y = ON_3dPoint::UnsetPoint.z;
              line.from.z = ON_3dPoint::UnsetPoint.x;
              line.to.x = ON_3dPoint::UnsetPoint.y;
              line.to.y = ON_3dPoint::UnsetPoint.z;
              break;
            }
          }
          bVar2 = ON_Line::IsValid((ON_Line *)auStack_5a8);
          if (bVar2) {
            ON_Xform::operator*(&local_630,(ON_Xform *)local_258,(ON_3dPoint *)auStack_5a8);
            clipping_bbox.m_max.z = local_630.x;
            ON_BoundingBox::Set((ON_BoundingBox *)&camera_ray.to.z,
                                (ON_3dPoint *)&clipping_bbox.m_max.z,1);
            ON_Xform::operator*((ON_3dPoint *)auStack_648,(ON_Xform *)local_258,
                                (ON_3dPoint *)&line.from.z);
            clipping_bbox.m_max.z = _auStack_648;
            ON_BoundingBox::Set((ON_BoundingBox *)&camera_ray.to.z,
                                (ON_3dPoint *)&clipping_bbox.m_max.z,1);
          }
        }
      }
      ON_Line::~ON_Line((ON_Line *)auStack_5a8);
    }
    local_798 = (ON_Line *)&bbox_lines[0xb].to.z;
    do {
      local_798 = local_798 + -1;
      ON_Line::~ON_Line(local_798);
    } while (local_798 != (ON_Line *)local_568);
  }
  local_649 = ON_BoundingBox::IsValid((ON_BoundingBox *)&camera_ray.to.z);
  if (local_649) {
    local_7d0 = (ON_Interval *)auStack_678;
    do {
      ON_Interval::ON_Interval(local_7d0);
      local_7d0 = local_7d0 + 1;
    } while (local_7d0 != (ON_Interval *)(extents[1].m_t + 1));
    for (local_67c = 0; local_67c < 2; local_67c = local_67c + 1) {
      pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&camera_ray.to.z,local_67c);
      dVar1 = *pdVar3;
      pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&clipping_bbox.m_min.z,local_67c);
      ON_Interval::Set((ON_Interval *)(extents[(long)local_67c + -1].m_t + 1),(dVar1 + 1.0) * 0.5,
                       (*pdVar3 + 1.0) * 0.5);
      bVar2 = ON_Interval::IsIncreasing((ON_Interval *)(extents[(long)local_67c + -1].m_t + 1));
      if ((((!bVar2) &&
           (bVar2 = ON_Interval::IsSingleton((ON_Interval *)(extents[(long)local_67c + -1].m_t + 1))
           , !bVar2)) ||
          ((bVar2 = ON_Interval::Intersection
                              ((ON_Interval *)(extents[(long)local_67c + -1].m_t + 1),
                               (ON_Interval *)&cam_loc.z), !bVar2 ||
           (bVar2 = ON_Interval::IsValid((ON_Interval *)(extents[(long)local_67c + -1].m_t + 1)),
           !bVar2)))) ||
         ((bVar2 = ON_Interval::IsIncreasing((ON_Interval *)(extents[(long)local_67c + -1].m_t + 1))
          , !bVar2 &&
          (bVar2 = ON_Interval::IsSingleton((ON_Interval *)(extents[(long)local_67c + -1].m_t + 1)),
          !bVar2)))) {
        local_649 = false;
        break;
      }
    }
    if (local_649 != false) {
      x_extents->m_t[0] = _auStack_678;
      x_extents->m_t[1] = extents[0].m_t[0];
      y_extents->m_t[0] = extents[0].m_t[1];
      y_extents->m_t[1] = extents[1].m_t[0];
    }
  }
  this_local._7_1_ = local_649;
LAB_0098dd26:
  ON_Line::~ON_Line((ON_Line *)local_138);
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::GetBoundingBoxProjectionExtents(
    ON_BoundingBox bbox,
    ON_Interval& x_extents,
    ON_Interval& y_extents
    ) const
{
  const ON_Interval unit_interval(0.0,1.0);
  x_extents = unit_interval;
  y_extents = unit_interval;

  if ( !bbox.IsValid() )
    return false;

  if ( !IsValidCamera() && !IsValidFrustum() )
    return false;

  const ON_3dPoint cam_loc = CameraLocation();
  if ( !cam_loc.IsValid() )
    return false;

  // far_rect[] points run image ccw 
  // (image lower left, lower right, upper right, upper left)
  ON_3dPoint far_rect[4];
  if ( !GetFarRect(far_rect[0],far_rect[1],far_rect[3],far_rect[2]) )
    return false;

  ON_3dPoint clipping_point(ON_UNSET_VALUE,ON_UNSET_VALUE,0.0);
  ON_BoundingBox clipping_bbox;
  clipping_bbox.m_min.z = clipping_point.z;
  clipping_bbox.m_max.z = clipping_point.z;

  ON_Line camera_ray(cam_loc,ON_3dPoint::UnsetPoint);
  for ( int i = 0; i < 4; i++ )
  {
    camera_ray.to = far_rect[i];
    for ( int j = 0; j < 3; j++ )
    {
      ON_PlaneEquation e(0==j ? 1.0 : 0.0, 1 == j ? 1.0 : 0.0, 2==j?1.0:0.0, 0.0);
      for ( int k = 0; k < 2; k++ )
      {
        ON_3dPoint bbox_point = k ? bbox.m_max : bbox.m_min;
        e.d = 0.0;
        e.d = -bbox_point[j];
        double t = ON_UNSET_VALUE;
        if ( ON_Intersect(camera_ray,e,&t) )
        {
          if ( t > 0.0 )
          {
            ON_3dPoint P = camera_ray.PointAt(t);
            P[j] = bbox_point[j];
            if ( bbox.IsPointIn(P) )
            {
              clipping_point.x = (1 == i || 2 == i) ? 1.0 : -1.0;
              clipping_point.y = (i >= 2) ? 1.0 : -1.0;
              clipping_bbox.Set(clipping_point,true);
            }
          }
        }
      }
    }
  }

  if (    clipping_bbox.m_min.x != -1.0 || clipping_bbox.m_min.y != -1.0
       || clipping_bbox.m_max.x !=  1.0 || clipping_bbox.m_max.y !=  1.0
     )
  {
    ON_Xform w2c;
    if ( !GetXform(ON::world_cs,ON::clip_cs,w2c) )
      return false;

    ON_PlaneEquation vp_near_plane;
    if ( !GetNearPlaneEquation(vp_near_plane) )
      return false;

    ON_PlaneEquation vp_far_plane;
    if ( !GetFarPlaneEquation(vp_far_plane) )
      return false;

    ON_PlaneEquation frustum_sides[4];
    if ( !GetFrustumLeftPlaneEquation(frustum_sides[0]) )
      return false;
    if ( !GetFrustumBottomPlaneEquation(frustum_sides[1]) )
      return false;
    if ( !GetFrustumRightPlaneEquation(frustum_sides[2]) )
      return false;
    if ( !GetFrustumTopPlaneEquation(frustum_sides[3]) )
      return false;

    ON_Line bbox_lines[12];
    bbox.GetEdges(bbox_lines);

    for ( int i = 0; i < 12; i++ )
    {
      ON_Line line = bbox_lines[i];

      if ( !TrimLineHelper( vp_near_plane, true, line ) )
        continue;

      if ( !TrimLineHelper( vp_far_plane, false, line ) )
        continue;

      for ( int j = 0; j < 4; j++ )
      {
        if ( !TrimLineHelper(frustum_sides[j],false,line) )
        {
          line.from = ON_3dPoint::UnsetPoint;
          line.to = ON_3dPoint::UnsetPoint;
          break;
        }
      }

      if ( !line.IsValid() )
        continue;      

      clipping_point = w2c*line.from;
      clipping_bbox.Set(clipping_point,true);

      clipping_point = w2c*line.to;
      clipping_bbox.Set(clipping_point,true);
    }
  }

  bool rc = clipping_bbox.IsValid();

  if ( rc )
  {
    ON_Interval extents[2];
    for ( int i = 0; i < 2; i++ )
    {
      extents[i].Set( 
        0.5*(clipping_bbox.m_min[i]+1.0),
        0.5*(clipping_bbox.m_max[i]+1.0)
        );    
      
      if ( extents[i].IsIncreasing() || extents[i].IsSingleton() )
      {
        if ( extents[i].Intersection(unit_interval) && extents[i].IsValid() )
        {
          if ( extents[i].IsIncreasing() )
            continue;
          if ( extents[i].IsSingleton() )
            continue;
        }
      }

      rc = false;
      break;
    }

    if ( rc )
    {
      x_extents = extents[0];
      y_extents = extents[1];
    }
  }


  return rc;
}